

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngset.c
# Opt level: O0

void png_set_hIST(png_const_structrp png_ptr,png_inforp info_ptr,png_const_uint_16p hist)

{
  png_uint_16p ppVar1;
  int local_24;
  int i;
  png_const_uint_16p hist_local;
  png_inforp info_ptr_local;
  png_const_structrp png_ptr_local;
  
  if ((png_ptr != (png_const_structrp)0x0) && (info_ptr != (png_inforp)0x0)) {
    if ((info_ptr->num_palette == 0) || (0x100 < info_ptr->num_palette)) {
      png_warning(png_ptr,"Invalid palette size, hIST allocation skipped");
    }
    else {
      png_free_data(png_ptr,info_ptr,8,0);
      ppVar1 = (png_uint_16p)png_malloc_warn(png_ptr,0x200);
      info_ptr->hist = ppVar1;
      if (info_ptr->hist == (png_uint_16p)0x0) {
        png_warning(png_ptr,"Insufficient memory for hIST chunk data");
      }
      else {
        info_ptr->free_me = info_ptr->free_me | 8;
        for (local_24 = 0; local_24 < (int)(uint)info_ptr->num_palette; local_24 = local_24 + 1) {
          info_ptr->hist[local_24] = hist[local_24];
        }
        info_ptr->valid = info_ptr->valid | 0x40;
      }
    }
  }
  return;
}

Assistant:

void PNGAPI
png_set_hIST(png_const_structrp png_ptr, png_inforp info_ptr,
    png_const_uint_16p hist)
{
   int i;

   png_debug1(1, "in %s storage function", "hIST");

   if (png_ptr == NULL || info_ptr == NULL)
      return;

   if (info_ptr->num_palette == 0 || info_ptr->num_palette
       > PNG_MAX_PALETTE_LENGTH)
   {
      png_warning(png_ptr,
          "Invalid palette size, hIST allocation skipped");

      return;
   }

   png_free_data(png_ptr, info_ptr, PNG_FREE_HIST, 0);

   /* Changed from info->num_palette to PNG_MAX_PALETTE_LENGTH in
    * version 1.2.1
    */
   info_ptr->hist = png_voidcast(png_uint_16p, png_malloc_warn(png_ptr,
       PNG_MAX_PALETTE_LENGTH * (sizeof (png_uint_16))));

   if (info_ptr->hist == NULL)
   {
      png_warning(png_ptr, "Insufficient memory for hIST chunk data");

      return;
   }

   info_ptr->free_me |= PNG_FREE_HIST;

   for (i = 0; i < info_ptr->num_palette; i++)
      info_ptr->hist[i] = hist[i];

   info_ptr->valid |= PNG_INFO_hIST;
}